

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

Am_Point_List compute_arrowhead(Am_Point_List *pl)

{
  Am_Add_Position AVar1;
  ulong uVar2;
  Am_Point_List *pAVar3;
  Am_Point_Item *extraout_RDX;
  Am_Point_Item *extraout_RDX_00;
  Am_Point_Item *pAVar4;
  int *in_RSI;
  double dVar5;
  Am_Point_List AVar6;
  bool local_89;
  Am_Point_List local_60;
  float local_50;
  float local_4c;
  float dyb;
  float dxb;
  float dya;
  float dxa;
  float b;
  float a;
  float scale;
  float d;
  int dy;
  int dx;
  int y2;
  int x2;
  int y1;
  int x1;
  Am_Point_List *pl_local;
  
  pl_local = pl;
  Am_Point_List::Start();
  uVar2 = Am_Point_List::Last();
  if ((uVar2 & 1) == 0) {
    Am_Point_List::Get(in_RSI,&x2);
    do {
      Am_Point_List::Next();
      uVar2 = Am_Point_List::Last();
      if ((uVar2 & 1) == 0) {
        Am_Point_List::Get(in_RSI,&dx);
      }
      else {
        dx = x2 + 1;
        dy = y2;
      }
      local_89 = x2 == dx && y2 == dy;
    } while (local_89);
    d = (float)(dx - x2);
    scale = (float)(dy - y2);
    dVar5 = sqrt((double)((int)d * (int)d + (int)scale * (int)scale));
    a = (float)dVar5;
    b = 5.0 / a;
    dxa = 0.8660254;
    dya = 0.5;
    dxb = ((float)(int)d * -0.8660254 + (float)(int)scale * -0.5) * b;
    dyb = ((float)(int)d * 0.5 + (float)(int)scale * -0.8660254) * b;
    local_4c = ((float)(int)d * -0.8660254 + (float)(int)scale * 0.5) * b;
    local_50 = ((float)(int)d * -0.5 + (float)(int)scale * -0.8660254) * b;
    Am_Point_List::Am_Point_List(&local_60);
    AVar1 = Am_Point_List::Add((float)(x2 + (int)dxb),(float)(y2 + (int)dyb),
                               (Am_Add_Position)&local_60,true);
    AVar1 = Am_Point_List::Add((float)x2,(float)y2,AVar1,true);
    pAVar3 = (Am_Point_List *)
             Am_Point_List::Add((float)(x2 + (int)local_4c),(float)(y2 + (int)local_50),AVar1,true);
    Am_Point_List::Am_Point_List(pl,pAVar3);
    Am_Point_List::~Am_Point_List(&local_60);
    pAVar4 = extraout_RDX_00;
  }
  else {
    Am_Point_List::Am_Point_List(pl,(Am_Point_List_Data *)0x0);
    pAVar4 = extraout_RDX;
  }
  AVar6.item = pAVar4;
  AVar6.data = (Am_Point_List_Data *)pl;
  return AVar6;
}

Assistant:

Am_Point_List
compute_arrowhead(Am_Point_List pl)
{
  int x1, y1, x2, y2;

  // get the first two distinct points out of pl into (x1,y1) and (x2,y2)
  pl.Start();
  if (pl.Last())
    return nullptr;
  pl.Get(x1, y1);

  do {
    pl.Next();
    if (pl.Last()) {
      x2 = x1 + 1;
      y2 = y1;
    } else
      pl.Get(x2, y2);

  } while (x1 == x2 && y1 == y2);

  // compute a 60 degree angle with vertex at x1,y1, pointing toward x2,y2
  int dx = x2 - x1;
  int dy = y2 - y1;
  float d = sqrt((double)(dx * dx + dy * dy));
  float scale = ARROWHEAD_LENGTH / d;

  const float a = 0.8660254037844; // cos(30 deg)
  const float b = 0.5;             // sin(30 deg)

  float dxa = (-a * dx - b * dy) * scale;
  float dya = (b * dx - a * dy) * scale;
  float dxb = (-a * dx + b * dy) * scale;
  float dyb = (-b * dx - a * dy) * scale;

  return Am_Point_List()
      .Add(x1 + (int)dxa, y1 + (int)dya)
      .Add(x1, y1)
      .Add(x1 + (int)dxb, y1 + (int)dyb);
}